

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O1

uint32_t __thiscall
dg::llvmdg::LLVMSlicer::slice
          (LLVMSlicer *this,LLVMDependenceGraph *dg,LLVMNode *start,uint32_t sl_id)

{
  Value *pVVar1;
  iterator iVar2;
  StringRef SVar3;
  bool bVar4;
  char cVar5;
  undefined *puVar6;
  uint uVar7;
  undefined *puVar8;
  uint uVar9;
  Function **ppFVar10;
  long lVar11;
  long lVar12;
  Function *pFVar13;
  StringRef SVar14;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> to_erase;
  uint32_t local_5c;
  Function **local_58;
  iterator iStack_50;
  Function **local_48;
  StringRef local_40;
  
  local_5c = sl_id;
  if (start != (LLVMNode *)0x0) {
    local_5c = Slicer<dg::LLVMNode>::mark(&this->super_Slicer<dg::LLVMNode>,start,sl_id,false);
  }
  SVar14.Length = local_40.Length;
  SVar14.Data = local_40.Data;
  local_58 = (Function **)0x0;
  iStack_50._M_current = (Function **)0x0;
  local_48 = (Function **)0x0;
  lVar12 = *(long *)(*(long *)(dg + 0x140) + 0x20);
  lVar11 = *(long *)(dg + 0x140) + 0x18;
  ppFVar10 = local_58;
  iVar2._M_current = iStack_50._M_current;
  if (lVar12 != lVar11) {
    do {
      pFVar13 = (Function *)(lVar12 - 0x38);
      if (lVar12 == 0) {
        pFVar13 = (Function *)0x0;
      }
      local_40 = SVar14;
      SVar14 = (StringRef)llvm::Value::getName();
      local_40 = SVar14;
      bVar4 = dontTouch(this,&local_40);
      SVar14 = local_40;
      puVar6 = &llvm::cl::Option::vtable;
      puVar8 = __M_insert<long>;
      if (!bVar4) {
        for (; puVar8 != (undefined *)0x0;
            puVar8 = *(undefined **)
                      (puVar8 + (ulong)(*(Function **)(puVar8 + 0x20) < pFVar13) * 8 + 0x10)) {
          if (*(Function **)(puVar8 + 0x20) >= pFVar13) {
            puVar6 = puVar8;
          }
        }
        puVar8 = &llvm::cl::Option::vtable;
        if ((puVar6 != &llvm::cl::Option::vtable) &&
           (puVar8 = puVar6, pFVar13 < *(Function **)(puVar6 + 0x20))) {
          puVar8 = &llvm::cl::Option::vtable;
        }
        if (puVar8 == &llvm::cl::Option::vtable) {
          cVar5 = llvm::GlobalValue::isDeclaration();
          SVar3.Length = local_40.Length;
          SVar3.Data = (char *)pFVar13;
          SVar14 = local_40;
          if (cVar5 == '\0') {
            if (iStack_50._M_current == local_48) {
              local_40.Data = (char *)pFVar13;
              std::vector<llvm::Function*,std::allocator<llvm::Function*>>::
              _M_realloc_insert<llvm::Function*>
                        ((vector<llvm::Function*,std::allocator<llvm::Function*>> *)&local_58,
                         iStack_50,(Function **)&local_40);
              SVar14.Length = local_40.Length;
              SVar14.Data = local_40.Data;
            }
            else {
              *iStack_50._M_current = pFVar13;
              iStack_50._M_current = iStack_50._M_current + 1;
              SVar14 = SVar3;
            }
          }
        }
        else {
          sliceGraph(this,*(LLVMDependenceGraph **)(puVar8 + 0x28),local_5c);
          SVar14 = local_40;
        }
      }
      lVar12 = *(long *)(lVar12 + 8);
      ppFVar10 = local_58;
      iVar2._M_current = iStack_50._M_current;
    } while (lVar12 != lVar11);
  }
  for (; local_40 = SVar14, ppFVar10 != iVar2._M_current; ppFVar10 = ppFVar10 + 1) {
    pVVar1 = (Value *)*ppFVar10;
    llvm::UndefValue::get(*(Type **)pVVar1);
    llvm::Value::replaceAllUsesWith(pVVar1);
    llvm::Function::dropAllReferences();
    uVar7 = *(uint *)(pVVar1 + 0x20) & 0xfffffff0;
    uVar9 = uVar7 | 0x4000;
    if ((*(uint *)(pVVar1 + 0x20) & 0x30) == 0) {
      uVar9 = uVar7;
    }
    *(uint *)(pVVar1 + 0x20) = uVar9;
    llvm::Function::eraseFromParent();
    SVar14 = local_40;
  }
  if (local_58 != (Function **)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return local_5c;
}

Assistant:

uint32_t slice(LLVMDependenceGraph *dg, LLVMNode *start,
                   uint32_t sl_id = 0) {
        // mark nodes for slicing
        assert(start || sl_id != 0);
        if (start)
            sl_id = mark(start, sl_id);

        std::vector<llvm::Function *> to_erase;
        for (auto &F : *dg->getModule()) {
            if (dontTouch(F.getName()))
                continue;

            auto it = constructedFunctions.find(&F);
            if (it == constructedFunctions.end()) {
                // remove (defined) functions that we didn't even constructed,
                // those are irrelevant in the slice
                if (!F.isDeclaration()) {
                    to_erase.push_back(&F);
                }
            } else {
                LLVMDependenceGraph *subdg = it->second;
                sliceGraph(subdg, sl_id);
            }
        }
        for (auto *F : to_erase) {
            F->replaceAllUsesWith(llvm::UndefValue::get(F->getType()));
            F->deleteBody();
            F->eraseFromParent();
        }

        return sl_id;
    }